

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u16 cellSizePtr(MemPage *pPage,u8 *pCell)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  u8 *puVar4;
  u8 *puVar5;
  byte *pbVar6;
  bool local_31;
  uint local_2c;
  int minLocal;
  u32 nSize;
  u8 *pEnd;
  u8 *pIter;
  u8 *pCell_local;
  MemPage *pPage_local;
  
  pbVar3 = pCell + (int)(uint)pPage->childPtrSize;
  local_2c = (uint)*pbVar3;
  pEnd = pbVar3;
  if (0x7f < local_2c) {
    local_2c = local_2c & 0x7f;
    do {
      pbVar6 = pEnd + 1;
      local_2c = local_2c << 7 | pEnd[1] & 0x7f;
      local_31 = 0x7f < *pbVar6 && pbVar6 < pbVar3 + 8;
      pEnd = pbVar6;
    } while (local_31);
  }
  puVar5 = pEnd + 1;
  if (pPage->intKey != '\0') {
    puVar4 = pEnd + 10;
    pEnd = pEnd + 1;
    do {
      puVar5 = pEnd + 1;
      bVar1 = *pEnd;
      pEnd = puVar5;
    } while ((bVar1 & 0x80) != 0 && puVar5 < puVar4);
  }
  pEnd = puVar5;
  if (pPage->maxLocal < local_2c) {
    uVar2 = (uint)pPage->minLocal;
    local_2c = uVar2 + (local_2c - uVar2) % (pPage->pBt->usableSize - 4);
    if (pPage->maxLocal < local_2c) {
      local_2c = uVar2;
    }
    local_2c._0_2_ = ((short)pEnd - (short)pCell) + 4 + (short)local_2c;
  }
  else {
    local_2c = ((int)pEnd - (int)pCell) + local_2c;
    if (local_2c < 4) {
      local_2c = 4;
    }
  }
  return (u16)local_2c;
}

Assistant:

static u16 cellSizePtr(MemPage *pPage, u8 *pCell){
  u8 *pIter = pCell + pPage->childPtrSize; /* For looping over bytes of pCell */
  u8 *pEnd;                                /* End mark for a varint */
  u32 nSize;                               /* Size value to return */

#ifdef SQLITE_DEBUG
  /* The value returned by this function should always be the same as
  ** the (CellInfo.nSize) value found by doing a full parse of the
  ** cell. If SQLITE_DEBUG is defined, an assert() at the bottom of
  ** this function verifies that this invariant is not violated. */
  CellInfo debuginfo;
  pPage->xParseCell(pPage, pCell, &debuginfo);
#endif

  nSize = *pIter;
  if( nSize>=0x80 ){
    pEnd = &pIter[8];
    nSize &= 0x7f;
    do{
      nSize = (nSize<<7) | (*++pIter & 0x7f);
    }while( *(pIter)>=0x80 && pIter<pEnd );
  }
  pIter++;
  if( pPage->intKey ){
    /* pIter now points at the 64-bit integer key value, a variable length 
    ** integer. The following block moves pIter to point at the first byte
    ** past the end of the key value. */
    pEnd = &pIter[9];
    while( (*pIter++)&0x80 && pIter<pEnd );
  }
  testcase( nSize==pPage->maxLocal );
  testcase( nSize==pPage->maxLocal+1 );
  if( nSize<=pPage->maxLocal ){
    nSize += (u32)(pIter - pCell);
    if( nSize<4 ) nSize = 4;
  }else{
    int minLocal = pPage->minLocal;
    nSize = minLocal + (nSize - minLocal) % (pPage->pBt->usableSize - 4);
    testcase( nSize==pPage->maxLocal );
    testcase( nSize==pPage->maxLocal+1 );
    if( nSize>pPage->maxLocal ){
      nSize = minLocal;
    }
    nSize += 4 + (u16)(pIter - pCell);
  }
  assert( nSize==debuginfo.nSize || CORRUPT_DB );
  return (u16)nSize;
}